

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::DatePartFunction<duckdb::dtime_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  long *plVar5;
  SelectionVector *count;
  data_ptr_t pdVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var8;
  sel_t *psVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  reference vector;
  reference vector_00;
  long lVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  SelectionVector *pSVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  undefined1 *puVar19;
  SelectionVector *pSVar20;
  ulong uVar21;
  data_ptr_t pdVar22;
  ulong uVar23;
  SelectionVector *pSVar24;
  data_ptr_t pdVar25;
  idx_t idx_in_entry;
  ValidityMask *other;
  unsigned_long uVar26;
  data_ptr_t pdVar27;
  UnifiedVectorFormat ldata;
  data_ptr_t local_f8;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  data_ptr_t local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar5 = (long *)result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      lVar15 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                         (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                          *(undefined8 *)vector_00->data);
      *plVar5 = lVar15;
      return;
    }
  }
  else {
    count = (SelectionVector *)args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      local_f8 = vector->data;
      pdVar25 = vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          _Var18._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar22 = local_c8.data;
          pSVar24 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar22;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var18._M_head_impl =
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var18._M_head_impl;
        if (_Var18._M_head_impl != (unsigned_long *)0x0) {
          puVar19 = (undefined1 *)
                    ((long)&count[2].selection_data.internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 7);
          if (puVar19 < (undefined1 *)0x40) {
            return;
          }
          uVar21 = 0;
          pSVar24 = (SelectionVector *)0x0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar4[uVar21];
            }
            pSVar17 = (SelectionVector *)
                      &pSVar24[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar17) {
              pSVar17 = count;
            }
            pSVar20 = pSVar17;
            if (uVar26 != 0) {
              pSVar20 = pSVar24;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar24 < pSVar17) {
                  uVar10 = *(undefined8 *)pdVar25;
                  pdVar22 = local_f8 + (long)pSVar24 * 0x10 + 8;
                  do {
                    lVar15 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                       (*(undefined8 *)(pdVar22 + -8),*(undefined8 *)pdVar22,uVar10)
                    ;
                    *(long *)(pdVar6 + (long)pSVar24 * 8) = lVar15;
                    pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                    pdVar22 = pdVar22 + 0x10;
                    pSVar20 = pSVar24;
                  } while (pSVar17 != pSVar24);
                }
              }
              else if (pSVar24 < pSVar17) {
                pdVar22 = local_f8 + (long)pSVar24 * 0x10 + 8;
                uVar23 = 0;
                do {
                  if ((uVar26 >> (uVar23 & 0x3f) & 1) != 0) {
                    lVar15 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                       (*(undefined8 *)(pdVar22 + -8),*(undefined8 *)pdVar22,
                                        *(undefined8 *)pdVar25);
                    *(long *)(pdVar6 + uVar23 * 8 + (long)pSVar24 * 8) = lVar15;
                  }
                  uVar23 = uVar23 + 1;
                  pdVar22 = pdVar22 + 0x10;
                } while ((long)pSVar24 + (uVar23 - (long)pSVar17) != 0);
                pSVar20 = (SelectionVector *)((long)&pSVar24->sel_vector + uVar23);
              }
            }
            uVar21 = uVar21 + 1;
            pSVar24 = pSVar20;
          } while (uVar21 != (ulong)puVar19 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar10 = *(undefined8 *)pdVar25;
        local_f8 = local_f8 + 8;
        pSVar24 = (SelectionVector *)0x0;
        do {
          lVar15 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                             (*(undefined8 *)(local_f8 + -8),*(undefined8 *)local_f8,uVar10);
          *(long *)(pdVar6 + (long)pSVar24 * 8) = lVar15;
          pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
          local_f8 = local_f8 + 0x10;
        } while (count != pSVar24);
        return;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar25 = vector->data;
          pdVar6 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar22 = result->data;
          FlatVector::VerifyFlatVector(result);
          this = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
          if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_78.sel = count;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            _Var18._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_78.sel = count;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                       (unsigned_long *)&local_78);
            pdVar27 = local_c8.data;
            pSVar24 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar24;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var18._M_head_impl =
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var18._M_head_impl;
          FlatVector::VerifyFlatVector(vector_00);
          other = &vector_00->validity;
          if (_Var18._M_head_impl == (unsigned_long *)0x0) {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
            if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_78.sel = count;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              _Var18._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_78.sel = count;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)other,(unsigned_long *)&local_78);
              pdVar27 = local_c8.data;
              pSVar24 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar24;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var18._M_head_impl =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var18._M_head_impl;
          }
          else {
            ValidityMask::Combine(this,other,(idx_t)count);
          }
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              pdVar25 = pdVar25 + 8;
              pSVar24 = (SelectionVector *)0x0;
              do {
                lVar15 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                   (*(undefined8 *)(pdVar25 + -8),*(undefined8 *)pdVar25,
                                    *(undefined8 *)(pdVar6 + (long)pSVar24 * 8));
                *(long *)(pdVar22 + (long)pSVar24 * 8) = lVar15;
                pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                pdVar25 = pdVar25 + 0x10;
              } while (count != pSVar24);
            }
          }
          else {
            puVar19 = (undefined1 *)
                      ((long)&count[2].selection_data.internal.
                              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 7);
            if ((undefined1 *)0x3f < puVar19) {
              pdVar25 = pdVar25 + 8;
              uVar21 = 0;
              pSVar24 = (SelectionVector *)0x0;
              local_d8 = pdVar25;
              do {
                puVar4 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar4 == (unsigned_long *)0x0) {
                  uVar26 = 0xffffffffffffffff;
                }
                else {
                  uVar26 = puVar4[uVar21];
                }
                pSVar17 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar17) {
                  pSVar17 = count;
                }
                pSVar20 = pSVar17;
                if (uVar26 != 0) {
                  pSVar20 = pSVar24;
                  if (uVar26 == 0xffffffffffffffff) {
                    if (pSVar24 < pSVar17) {
                      pdVar27 = pdVar25 + (long)pSVar24 * 0x10;
                      do {
                        lVar15 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                           (*(undefined8 *)(pdVar27 + -8),*(undefined8 *)pdVar27,
                                            *(undefined8 *)(pdVar6 + (long)pSVar20 * 8));
                        *(long *)(pdVar22 + (long)pSVar20 * 8) = lVar15;
                        pSVar20 = (SelectionVector *)((long)&pSVar20->sel_vector + 1);
                        pdVar27 = pdVar27 + 0x10;
                      } while (pSVar17 != pSVar20);
                    }
                  }
                  else if (pSVar24 < pSVar17) {
                    pdVar25 = pdVar25 + (long)pSVar24 * 0x10;
                    uVar23 = 0;
                    do {
                      if ((uVar26 >> (uVar23 & 0x3f) & 1) != 0) {
                        lVar15 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                           (*(undefined8 *)(pdVar25 + -8),*(undefined8 *)pdVar25,
                                            *(undefined8 *)(pdVar6 + uVar23 * 8 + (long)pSVar24 * 8)
                                           );
                        *(long *)(pdVar22 + uVar23 * 8 + (long)pSVar24 * 8) = lVar15;
                      }
                      uVar23 = uVar23 + 1;
                      pdVar25 = pdVar25 + 0x10;
                    } while ((long)pSVar24 + (uVar23 - (long)pSVar17) != 0);
                    pSVar20 = (SelectionVector *)((long)&pSVar24->sel_vector + uVar23);
                    pdVar25 = local_d8;
                  }
                }
                uVar21 = uVar21 + 1;
                pSVar24 = pSVar20;
              } while (uVar21 != (ulong)puVar19 >> 6);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&local_c8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar25 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              _Var8._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar9 = (local_78.sel)->sel_vector;
              pSVar24 = (SelectionVector *)0x0;
              do {
                pSVar17 = pSVar24;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var8._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar17 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var8._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar24 * 4);
                }
                pSVar20 = pSVar24;
                if (psVar9 != (sel_t *)0x0) {
                  pSVar20 = (SelectionVector *)(ulong)psVar9[(long)pSVar24];
                }
                uVar11._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar17 * 0x10))->_M_use_count;
                uVar11._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar17 * 0x10))->_M_weak_count;
                lVar15 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar17 * 0x10))->_vptr__Sp_counted_base,
                                    uVar11,*(undefined8 *)(local_78.data + (long)pSVar20 * 8));
                *(long *)(pdVar25 + (long)pSVar24 * 8) = lVar15;
                pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
              } while (count != pSVar24);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            _Var8._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar9 = (local_78.sel)->sel_vector;
            pSVar24 = (SelectionVector *)0x0;
            do {
              pSVar17 = pSVar24;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var8._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar17 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var8._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar24 * 4);
              }
              pSVar20 = pSVar24;
              if (psVar9 != (sel_t *)0x0) {
                pSVar20 = (SelectionVector *)(ulong)psVar9[(long)pSVar24];
              }
              if (((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar17 >> 6] >> ((ulong)pSVar17 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar20 >> 6] >> ((ulong)pSVar20 & 0x3f) & 1) != 0)))) {
                uVar10._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar17 * 0x10))->_M_use_count;
                uVar10._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar17 * 0x10))->_M_weak_count;
                lVar15 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar17 * 0x10))->_vptr__Sp_counted_base,
                                    uVar10,*(undefined8 *)(local_78.data + (long)pSVar20 * 8));
                *(long *)(pdVar25 + (long)pSVar24 * 8) = lVar15;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var14 = p_Stack_e0;
                  peVar13 = local_e8;
                  local_e8 = (element_type *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar13;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var14;
                  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                  }
                  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar16->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar12 = (byte)pSVar24 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + ((ulong)pSVar24 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
              }
              pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
            } while (count != pSVar24);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar25 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar6 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar22 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          _Var18._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar27 = local_c8.data;
          pSVar24 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var18._M_head_impl =
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var18._M_head_impl;
        if (_Var18._M_head_impl != (unsigned_long *)0x0) {
          puVar19 = (undefined1 *)
                    ((long)&count[2].selection_data.internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 7);
          if (puVar19 < (undefined1 *)0x40) {
            return;
          }
          uVar21 = 0;
          pSVar24 = (SelectionVector *)0x0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar4[uVar21];
            }
            pSVar17 = (SelectionVector *)
                      &pSVar24[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar17) {
              pSVar17 = count;
            }
            pSVar20 = pSVar17;
            if (uVar26 != 0) {
              pSVar20 = pSVar24;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar24 < pSVar17) {
                  uVar10 = *(undefined8 *)pdVar25;
                  uVar11 = *(undefined8 *)(pdVar25 + 8);
                  do {
                    lVar15 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                       (uVar10,uVar11,*(undefined8 *)(pdVar6 + (long)pSVar20 * 8));
                    *(long *)(pdVar22 + (long)pSVar20 * 8) = lVar15;
                    pSVar20 = (SelectionVector *)((long)&pSVar20->sel_vector + 1);
                  } while (pSVar17 != pSVar20);
                }
              }
              else if (pSVar24 < pSVar17) {
                uVar23 = 0;
                do {
                  if ((uVar26 >> (uVar23 & 0x3f) & 1) != 0) {
                    lVar15 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                       (*(undefined8 *)pdVar25,*(undefined8 *)(pdVar25 + 8),
                                        *(undefined8 *)(pdVar6 + uVar23 * 8 + (long)pSVar24 * 8));
                    *(long *)(pdVar22 + uVar23 * 8 + (long)pSVar24 * 8) = lVar15;
                  }
                  uVar23 = uVar23 + 1;
                } while ((long)pSVar24 + (uVar23 - (long)pSVar17) != 0);
                pSVar20 = (SelectionVector *)((long)&pSVar24->sel_vector + uVar23);
              }
            }
            uVar21 = uVar21 + 1;
            pSVar24 = pSVar20;
          } while (uVar21 != (ulong)puVar19 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar10 = *(undefined8 *)pdVar25;
        uVar11 = *(undefined8 *)(pdVar25 + 8);
        pSVar24 = (SelectionVector *)0x0;
        do {
          lVar15 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                             (uVar10,uVar11,*(undefined8 *)(pdVar6 + (long)pSVar24 * 8));
          *(long *)(pdVar22 + (long)pSVar24 * 8) = lVar15;
          pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
        } while (count != pSVar24);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}